

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformBufferBufferCase::testUniformBuffers
          (UniformBufferBufferCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  bool bVar2;
  long size;
  long lVar3;
  GLuint uniformIndices [2];
  StateQueryMemoryWriteGuard<int> state;
  GLuint buffers [2];
  char *uniformNames [2];
  BufferRequirements requirements [4];
  GLuint local_1f8 [3];
  int local_1ec;
  StateQueryMemoryWriteGuard<long> local_1e8;
  GLuint local_1d0;
  GLuint local_1cc;
  char *local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  GLuint local_1a8;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined4 local_198;
  undefined4 local_194;
  long local_190;
  undefined4 local_188;
  undefined4 local_184;
  long local_180;
  ios_base local_140 [272];
  
  local_1c8 = "input1";
  uStack_1c0 = "input2";
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  this_00 = &(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glGetUniformIndices
            (this_00,(this->super_UniformBufferCase).m_program,2,&local_1c8,local_1f8);
  local_1e8.m_preguard = -0x2121212121212122;
  local_1e8.m_value = CONCAT44(local_1e8.m_value._4_4_,0xdededede);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8a34,(GLint *)((long)&local_1e8.m_preguard + 4));
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_1e8,
                     (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx);
  if (bVar2) {
    iVar1 = local_1e8.m_preguard._4_4_;
    lVar3 = (long)local_1e8.m_preguard._4_4_;
    if (lVar3 < 0x101) {
      if (local_1e8.m_preguard._4_4_ != -1) {
        local_1b8 = (undefined1  [8])
                    ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Alignment is ",0xd);
        std::ostream::operator<<((ostringstream *)&local_1b0,iVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        std::ios_base::~ios_base(local_140);
        local_1ec = iVar1 * 2;
        local_1f8[2] = iVar1 * 3 + 8;
        glu::CallLogWrapper::glGenBuffers(this_00,2,&local_1d0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,local_1d0);
        glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x20,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,local_1f8[0],local_1d0);
        ApiCase::expectError((ApiCase *)this,0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,local_1cc);
        glu::CallLogWrapper::glBufferData(this_00,0x8a11,(long)(int)local_1f8[2],(void *)0x0,0x88e8)
        ;
        size = (long)local_1ec;
        glu::CallLogWrapper::glBindBufferRange(this_00,0x8a11,local_1f8[1],local_1cc,lVar3,size);
        ApiCase::expectError((ApiCase *)this,0);
        local_1b8._4_4_ = 0x8a29;
        local_1b8._0_4_ = local_1f8[0];
        local_1b0 = (_func_int **)0x0;
        local_1a8 = local_1f8[0];
        local_1a4 = 0x8a2a;
        local_1a0 = 0;
        local_198 = local_1f8[1];
        local_194 = 0x8a29;
        local_190 = lVar3;
        local_188 = local_1f8[1];
        local_184 = 0x8a2a;
        local_180 = size;
        lVar3 = 8;
        do {
          local_1e8.m_postguard = -0x2121212121212122;
          local_1e8.m_preguard = -0x2121212121212122;
          local_1e8.m_value = -0x2121212121212122;
          glu::CallLogWrapper::glGetInteger64i_v
                    (this_00,*(GLenum *)((long)&uStack_1c0 + lVar3 + 4),
                     *(GLuint *)((long)&uStack_1c0 + lVar3),&local_1e8.m_value);
          bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                            (&local_1e8,
                             (this->super_UniformBufferCase).super_ApiCase.super_TestCase.
                             super_TestCase.super_TestNode.m_testCtx);
          if (bVar2) {
            checkIntEquals((this->super_UniformBufferCase).super_ApiCase.super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx,local_1e8.m_value,
                           *(GLint64 *)(local_1b8 + lVar3));
          }
          ApiCase::expectError((ApiCase *)this,0);
          lVar3 = lVar3 + 0x10;
        } while (lVar3 != 0x48);
        glu::CallLogWrapper::glDeleteBuffers(this_00,2,&local_1d0);
      }
    }
    else {
      local_1b8 = (undefined1  [8])
                  ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "// ERROR: UNIFORM_BUFFER_OFFSET_ALIGNMENT has a maximum value of 256.",0x45);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
      std::ios_base::~ios_base(local_140);
      tcu::TestContext::setTestResult
                ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "invalid UNIFORM_BUFFER_OFFSET_ALIGNMENT value");
    }
  }
  return;
}

Assistant:

void testUniformBuffers (void)
	{
		const char* uniformNames[] =
		{
			"input1",
			"input2"
		};
		GLuint uniformIndices[2] = {0};
		glGetUniformIndices(m_program, 2, uniformNames, uniformIndices);

		const GLint alignment = GetAlignment();
		if (alignment == -1) // cannot continue without this
			return;

		m_testCtx.getLog() << tcu::TestLog::Message << "Alignment is " << alignment << tcu::TestLog::EndMessage;

		int rangeBufferOffset		= alignment;
		int rangeBufferSize			= alignment * 2;
		int rangeBufferTotalSize	= rangeBufferOffset + rangeBufferSize + 8; // + 8 has no special meaning, just to make it != with the size of the range

		GLuint buffers[2];
		glGenBuffers(2, buffers);

		glBindBuffer(GL_UNIFORM_BUFFER, buffers[0]);
		glBufferData(GL_UNIFORM_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_UNIFORM_BUFFER, uniformIndices[0], buffers[0]);
		expectError(GL_NO_ERROR);

		glBindBuffer(GL_UNIFORM_BUFFER, buffers[1]);
		glBufferData(GL_UNIFORM_BUFFER, rangeBufferTotalSize, DE_NULL, GL_DYNAMIC_DRAW);
		glBindBufferRange(GL_UNIFORM_BUFFER, uniformIndices[1], buffers[1], rangeBufferOffset, rangeBufferSize);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE

		const struct BufferRequirements
		{
			GLuint	index;
			GLenum	pname;
			GLint64 value;
		} requirements[] =
		{
			{ uniformIndices[0], GL_UNIFORM_BUFFER_START,	0					},
			{ uniformIndices[0], GL_UNIFORM_BUFFER_SIZE,	0					},
			{ uniformIndices[1], GL_UNIFORM_BUFFER_START,	rangeBufferOffset	},
			{ uniformIndices[1], GL_UNIFORM_BUFFER_SIZE,	rangeBufferSize		}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requirements); ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint64> state;
			glGetInteger64i_v(requirements[ndx].pname, requirements[ndx].index, &state);

			if (state.verifyValidity(m_testCtx))
				checkIntEquals(m_testCtx, state, requirements[ndx].value);
			expectError(GL_NO_ERROR);
		}

		glDeleteBuffers(2, buffers);
	}